

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_dr_wav_get_bytes_per_pcm_frame(ma_dr_wav *pWav)

{
  ma_uint32 bytesPerFrame;
  ma_dr_wav *pWav_local;
  ma_uint32 local_4;
  
  if ((pWav->bitsPerSample & 7) == 0) {
    bytesPerFrame = (int)((uint)pWav->bitsPerSample * (uint)(pWav->fmt).channels) >> 3;
  }
  else {
    bytesPerFrame = (ma_uint32)(pWav->fmt).blockAlign;
  }
  if (((pWav->translatedFormatTag == 6) || (pWav->translatedFormatTag == 7)) &&
     (bytesPerFrame != (pWav->fmt).channels)) {
    local_4 = 0;
  }
  else {
    local_4 = bytesPerFrame;
  }
  return local_4;
}

Assistant:

MA_PRIVATE ma_uint32 ma_dr_wav_get_bytes_per_pcm_frame(ma_dr_wav* pWav)
{
    ma_uint32 bytesPerFrame;
    if ((pWav->bitsPerSample & 0x7) == 0) {
        bytesPerFrame = (pWav->bitsPerSample * pWav->fmt.channels) >> 3;
    } else {
        bytesPerFrame = pWav->fmt.blockAlign;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        if (bytesPerFrame != pWav->fmt.channels) {
            return 0;
        }
    }
    return bytesPerFrame;
}